

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

int __thiscall
CVmObjBigNum::calc_sinhcosh
          (CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,int is_cosh,int is_tanh)

{
  int iVar1;
  char *new_ext;
  char *local_20;
  
  iVar1 = setup_getp_0(this,self,retval,argc,&local_20);
  if (iVar1 == 0) {
    compute_sinhcosh_into(local_20,(this->super_CVmObject).ext_,is_cosh,is_tanh);
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::calc_sinhcosh(VMG_ vm_obj_id_t self,
                                vm_val_t *retval, uint *argc,
                                int is_cosh, int is_tanh)
{
    char *new_ext;

    /* check arguments and allocate the return value */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* calculate the result */
    compute_sinhcosh_into(new_ext, ext_, is_cosh, is_tanh);

    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}